

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

bool __thiscall GB::CheckDiv(GB *this,u16 old_div,u16 new_div,u8 old_tac,u8 new_tac)

{
  u8 uVar1;
  bool bVar2;
  bool bit;
  bool old_bit;
  u8 new_tac_local;
  u8 old_tac_local;
  u16 new_div_local;
  u16 old_div_local;
  GB *this_local;
  
  bVar2 = (new_div & CheckDiv::tima_mask[(int)(new_tac & 3)]) != 0;
  if ((((old_div & CheckDiv::tima_mask[(int)(old_tac & 3)]) != 0) == bVar2) || (bVar2)) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (this->s).io[5] + '\x01';
    (this->s).io[5] = uVar1;
    if (uVar1 == '\0') {
      (this->s).tima_overflow_tick = (this->s).tick;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GB::CheckDiv(u16 old_div, u16 new_div, u8 old_tac, u8 new_tac) {
  static const u16 tima_mask[] = {1 << 9, 1 << 3, 1 << 5, 1 << 7};
  bool old_bit = old_div & tima_mask[old_tac & 3];
  bool bit = new_div & tima_mask[new_tac & 3];
  if (old_bit != bit && !bit) {
    DPRINT(TIMER, "++tima: %02x->%02x\n", s.io[TIMA], (s.io[TIMA] + 1) & 0xff);
    if (++s.io[TIMA] == 0) {
      DPRINT(TIMER, "tima overflow, div:%04x->%04x tac:%02x->%02x\n", old_div,
             new_div, old_tac, new_tac);
      s.tima_overflow_tick = s.tick;
    }
    return true;
  }
  return false;
}